

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O1

HalfedgeHandle __thiscall
OpenMesh::TriConnectivity::insert_loop(TriConnectivity *this,HalfedgeHandle _hh)

{
  pointer *ppFVar1;
  VertexHandle _end_vh;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  BaseHandle _heh;
  BaseHandle _nheh;
  HalfedgeHandle HVar4;
  int iVar5;
  FaceHandle _fh;
  Halfedge *pHVar6;
  undefined4 extraout_var;
  Face *pFVar7;
  HalfedgeHandle _nheh_00;
  pointer ppBVar8;
  Face local_48;
  BaseHandle local_44;
  BaseHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  FaceHandle local_34;
  
  pHVar6 = ArrayKernel::halfedge
                     ((ArrayKernel *)this,
                      (HalfedgeHandle)
                      ((-((uint)_hh.super_BaseHandle.idx_ & 1) | 1) + (int)_hh.super_BaseHandle.idx_
                      ));
  _end_vh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,_hh);
  local_3c.idx_ = (pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  local_40.idx_ = (int)_end_vh.super_BaseHandle.idx_;
  HVar4 = ArrayKernel::new_edge((ArrayKernel *)this,(VertexHandle)local_3c.idx_,_end_vh);
  local_44 = _hh.super_BaseHandle.idx_;
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,_hh);
  local_34.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  local_48.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
  __position._M_current =
       (this->super_PolyConnectivity).super_ArrayKernel.faces_.
       super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_PolyConnectivity).super_ArrayKernel.faces_.
      super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
    _M_realloc_insert<OpenMesh::ArrayItems::Face>
              (&(this->super_PolyConnectivity).super_ArrayKernel.faces_,__position,&local_48);
  }
  else {
    ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
    ppFVar1 = &(this->super_PolyConnectivity).super_ArrayKernel.faces_.
               super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + 1;
  }
  _nheh_00.super_BaseHandle.idx_ =
       (BaseHandle)
       ((-((uint)HVar4.super_BaseHandle.idx_ & 1) | 1) + (int)HVar4.super_BaseHandle.idx_);
  local_38 = HVar4.super_BaseHandle.idx_;
  iVar5 = (*(this->super_PolyConnectivity).super_ArrayKernel.super_BaseKernel._vptr_BaseKernel[5])
                    (this);
  ppBVar2 = (this->super_PolyConnectivity).super_ArrayKernel.super_BaseKernel.fprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar8 = (this->super_PolyConnectivity).super_ArrayKernel.super_BaseKernel.fprops_.
                 properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar2;
      ppBVar8 = ppBVar8 + 1) {
    pBVar3 = *ppBVar8;
    if (pBVar3 != (BaseProperty *)0x0) {
      (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar5));
    }
  }
  _fh = ArrayKernel::handle((ArrayKernel *)this,
                            (this->super_PolyConnectivity).super_ArrayKernel.faces_.
                            super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  _heh.idx_ = local_44.idx_;
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,(HalfedgeHandle)local_44.idx_);
  ArrayKernel::set_next_halfedge_handle
            ((ArrayKernel *)this,
             (HalfedgeHandle)(pHVar6->prev_halfedge_handle_).super_BaseHandle.idx_,_nheh_00);
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_);
  ArrayKernel::set_next_halfedge_handle
            ((ArrayKernel *)this,_nheh_00,
             (HalfedgeHandle)
             (pHVar6->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_);
  _nheh.idx_ = local_38.idx_;
  ArrayKernel::set_next_halfedge_handle
            ((ArrayKernel *)this,(HalfedgeHandle)local_38.idx_,(HalfedgeHandle)_heh.idx_);
  ArrayKernel::set_next_halfedge_handle
            ((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_,(HalfedgeHandle)_nheh.idx_);
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,_nheh_00);
  (pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)local_34.super_BaseHandle.idx_;
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_);
  (pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh.super_BaseHandle.idx_;
  pHVar6 = ArrayKernel::halfedge((ArrayKernel *)this,(HalfedgeHandle)_nheh.idx_);
  (pHVar6->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh.super_BaseHandle.idx_;
  pFVar7 = ArrayKernel::face((ArrayKernel *)this,(FaceHandle)_fh.super_BaseHandle.idx_);
  (pFVar7->halfedge_handle_).super_BaseHandle.idx_ = _heh.idx_;
  if (local_34.super_BaseHandle.idx_ != -1) {
    pFVar7 = ArrayKernel::face((ArrayKernel *)this,local_34);
    (pFVar7->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh_00.super_BaseHandle.idx_;
  }
  PolyConnectivity::adjust_outgoing_halfedge
            (&this->super_PolyConnectivity,(VertexHandle)local_40.idx_);
  PolyConnectivity::adjust_outgoing_halfedge
            (&this->super_PolyConnectivity,(VertexHandle)local_3c.idx_);
  return (BaseHandle)(BaseHandle)local_38.idx_;
}

Assistant:

TriConnectivity::HalfedgeHandle
TriConnectivity::insert_loop(HalfedgeHandle _hh)
{
  HalfedgeHandle  h0(_hh);
  HalfedgeHandle  o0(opposite_halfedge_handle(h0));

  VertexHandle    v0(to_vertex_handle(o0));
  VertexHandle    v1(to_vertex_handle(h0));

  HalfedgeHandle  h1 = new_edge(v1, v0);
  HalfedgeHandle  o1 = opposite_halfedge_handle(h1);

  FaceHandle      f0 = face_handle(h0);
  FaceHandle      f1 = new_face();

  // halfedge -> halfedge
  set_next_halfedge_handle(prev_halfedge_handle(h0), o1);
  set_next_halfedge_handle(o1, next_halfedge_handle(h0));
  set_next_halfedge_handle(h1, h0);
  set_next_halfedge_handle(h0, h1);

  // halfedge -> face
  set_face_handle(o1, f0);
  set_face_handle(h0, f1);
  set_face_handle(h1, f1);

  // face -> halfedge
  set_halfedge_handle(f1, h0);
  if (f0.is_valid())
    set_halfedge_handle(f0, o1);


  // vertex -> halfedge
  adjust_outgoing_halfedge(v0);
  adjust_outgoing_halfedge(v1);

  return h1;
}